

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_proxy.h
# Opt level: O1

sc_lv_base * __thiscall
sc_dt::sc_proxy<sc_dt::sc_lv_base>::assign_(sc_proxy<sc_dt::sc_lv_base> *this,sc_unsigned *a)

{
  uint *puVar1;
  uint uVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  uint uVar5;
  sc_unsigned_bitref_r *this_00;
  uint64 uVar6;
  byte bVar7;
  sc_lv_base *x;
  uint i;
  ulong uVar8;
  uint uVar9;
  
  uVar2 = *(uint *)&this[1]._vptr_sc_proxy;
  uVar9 = a->nbits - 1;
  if ((int)uVar2 <= (int)uVar9) {
    uVar9 = uVar2;
  }
  if ((int)uVar9 < 1) {
    i = 0;
  }
  else {
    i = 0;
    do {
      this_00 = sc_unsigned::operator[](a,i);
      uVar6 = sc_unsigned_bitref_r::operator_cast_to_unsigned_long_long(this_00);
      bVar7 = (byte)i;
      uVar5 = 1 << (bVar7 & 0x1f);
      pp_Var3 = this[2]._vptr_sc_proxy;
      uVar8 = (ulong)(i >> 5);
      puVar1 = (uint *)((long)pp_Var3 + uVar8 * 4);
      *puVar1 = *puVar1 | uVar5;
      pp_Var4 = this[3]._vptr_sc_proxy;
      puVar1 = (uint *)((long)pp_Var4 + uVar8 * 4);
      *puVar1 = *puVar1 | uVar5;
      uVar5 = -2 << (bVar7 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar7 & 0x1f);
      puVar1 = (uint *)((long)pp_Var3 + uVar8 * 4);
      *puVar1 = *puVar1 & ((uint)(uVar6 != 0) << (bVar7 & 0x1f) | uVar5);
      puVar1 = (uint *)((long)pp_Var4 + uVar8 * 4);
      *puVar1 = *puVar1 & uVar5;
      i = i + 1;
    } while (uVar9 != i);
  }
  if ((int)i < (int)uVar2) {
    pp_Var3 = this[2]._vptr_sc_proxy;
    pp_Var4 = this[3]._vptr_sc_proxy;
    do {
      uVar9 = 1 << ((byte)i & 0x1f);
      uVar8 = (ulong)(i >> 5);
      puVar1 = (uint *)((long)pp_Var3 + uVar8 * 4);
      *puVar1 = *puVar1 | uVar9;
      puVar1 = (uint *)((long)pp_Var4 + uVar8 * 4);
      *puVar1 = *puVar1 | uVar9;
      bVar7 = (byte)i & 0x1f;
      uVar9 = -2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7;
      puVar1 = (uint *)((long)pp_Var3 + uVar8 * 4);
      *puVar1 = *puVar1 & uVar9;
      puVar1 = (uint *)((long)pp_Var4 + uVar8 * 4);
      *puVar1 = *puVar1 & uVar9;
      i = i + 1;
    } while (uVar2 != i);
  }
  return (sc_lv_base *)this;
}

Assistant:

X& assign_( const sc_signed& a )
	{ assign_v_( *this, a ); return back_cast(); }